

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

int killbuffer_cmd(int f,int n)

{
  int iVar1;
  char *__s1;
  buffer **bp;
  char local_428 [8];
  char bufn [1024];
  
  bp = (buffer **)curbp;
  if ((f & 8U) == 0) {
    __s1 = eread("Kill buffer (default %s): ",local_428,0x400,0x4a,(curbp->b_list).l_name);
    if (__s1 == (char *)0x0) {
      return 2;
    }
    bp = (buffer **)curbp;
    if (*__s1 != '\0') {
      bp = &bheadp;
      do {
        bp = (buffer **)(((buffer *)bp)->b_list).l_p.x_bp;
        if ((buffer *)bp == (buffer *)0x0) {
          bp = (buffer **)0x0;
          break;
        }
        iVar1 = strcmp(__s1,(((buffer *)bp)->b_list).l_name);
      } while (iVar1 != 0);
      if ((buffer *)bp == (buffer *)0x0) {
        return 0;
      }
    }
  }
  iVar1 = killbuffer((buffer *)bp);
  eerase();
  return iVar1;
}

Assistant:

int
killbuffer_cmd(int f, int n)
{
	struct buffer *bp;
	char    bufn[NBUFN], *bufp;
	int 	ret;

	if (f & FFRAND) /* dired mode 'q' */
		bp = curbp;
	else if ((bufp = eread("Kill buffer (default %s): ", bufn, NBUFN,
	    EFNUL | EFNEW | EFBUF, curbp->b_bname)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		bp = curbp;
	else if ((bp = bfind(bufp, FALSE)) == NULL)
		return (FALSE);
	ret = killbuffer(bp);
	eerase();

	return (ret);
}